

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::AddTestsForDashboardType(cmCTest *this,string *targ)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = std::operator==(targ,"Experimental");
  if (bVar1) {
    this->InteractiveDebugMode = false;
    this->TestModel = 0;
    pcVar2 = "ExperimentalStart";
LAB_002b05cd:
    SetTest(this,pcVar2 + 0xc,true);
    SetTest(this,"Configure",true);
    SetTest(this,"Build",true);
    pcVar2 = "Test";
LAB_002b0600:
    SetTest(this,pcVar2,true);
    SetTest(this,"Coverage",true);
  }
  else {
    bVar1 = std::operator==(targ,"ExperimentalStart");
    if (bVar1) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_002b0648:
      pcVar2 = "Start";
      goto LAB_002b073d;
    }
    bVar1 = std::operator==(targ,"ExperimentalUpdate");
    if (bVar1) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_002b0675:
      pcVar2 = "Update";
      goto LAB_002b073d;
    }
    bVar1 = std::operator==(targ,"ExperimentalConfigure");
    if (bVar1) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_002b06a2:
      pcVar2 = "Configure";
      goto LAB_002b073d;
    }
    bVar1 = std::operator==(targ,"ExperimentalBuild");
    if (bVar1) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_002b06cf:
      pcVar2 = "Build";
      goto LAB_002b073d;
    }
    bVar1 = std::operator==(targ,"ExperimentalTest");
    if (bVar1) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_002b06f9:
      pcVar2 = "Test";
      goto LAB_002b073d;
    }
    bVar1 = std::operator==(targ,"ExperimentalMemCheck");
    if ((bVar1) || (bVar1 = std::operator==(targ,"ExperimentalPurify"), bVar1)) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_002b0736:
      pcVar2 = "MemCheck";
      goto LAB_002b073d;
    }
    bVar1 = std::operator==(targ,"ExperimentalCoverage");
    if (bVar1) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_002b0770:
      pcVar2 = "Coverage";
      goto LAB_002b073d;
    }
    bVar1 = std::operator==(targ,"ExperimentalSubmit");
    if (!bVar1) {
      bVar1 = std::operator==(targ,"Continuous");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
LAB_002b07c3:
        SetTest(this,"Start",true);
        pcVar2 = "ExperimentalUpdate";
        goto LAB_002b05cd;
      }
      bVar1 = std::operator==(targ,"ContinuousStart");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_002b0648;
      }
      bVar1 = std::operator==(targ,"ContinuousUpdate");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_002b0675;
      }
      bVar1 = std::operator==(targ,"ContinuousConfigure");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_002b06a2;
      }
      bVar1 = std::operator==(targ,"ContinuousBuild");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_002b06cf;
      }
      bVar1 = std::operator==(targ,"ContinuousTest");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_002b06f9;
      }
      bVar1 = std::operator==(targ,"ContinuousMemCheck");
      if ((bVar1) || (bVar1 = std::operator==(targ,"ContinuousPurify"), bVar1)) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_002b0736;
      }
      bVar1 = std::operator==(targ,"ContinuousCoverage");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_002b0770;
      }
      bVar1 = std::operator==(targ,"ContinuousSubmit");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_002b061b;
      }
      bVar1 = std::operator==(targ,"Nightly");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_002b07c3;
      }
      bVar1 = std::operator==(targ,"NightlyStart");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_002b0648;
      }
      bVar1 = std::operator==(targ,"NightlyUpdate");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_002b0675;
      }
      bVar1 = std::operator==(targ,"NightlyConfigure");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_002b06a2;
      }
      bVar1 = std::operator==(targ,"NightlyBuild");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_002b06cf;
      }
      bVar1 = std::operator==(targ,"NightlyTest");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_002b06f9;
      }
      bVar1 = std::operator==(targ,"NightlyMemCheck");
      if ((bVar1) || (bVar1 = std::operator==(targ,"NightlyPurify"), bVar1)) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_002b0736;
      }
      bVar1 = std::operator==(targ,"NightlyCoverage");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_002b0770;
      }
      bVar1 = std::operator==(targ,"NightlySubmit");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_002b061b;
      }
      bVar1 = std::operator==(targ,"MemoryCheck");
      if (bVar1) {
        this->InteractiveDebugMode = false;
        this->TestModel = 0;
        pcVar2 = "ExperimentalStart";
      }
      else {
        bVar1 = std::operator==(targ,"NightlyMemoryCheck");
        if (!bVar1) {
          return false;
        }
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        SetTest(this,"Start",true);
        pcVar2 = "ExperimentalUpdate";
      }
      SetTest(this,pcVar2 + 0xc,true);
      SetTest(this,"Configure",true);
      SetTest(this,"Build",true);
      pcVar2 = "MemCheck";
      goto LAB_002b0600;
    }
    this->InteractiveDebugMode = false;
    this->TestModel = 0;
  }
LAB_002b061b:
  pcVar2 = "Submit";
LAB_002b073d:
  SetTest(this,pcVar2,true);
  return true;
}

Assistant:

bool cmCTest::AddTestsForDashboardType(std::string &targ)
{
  if ( targ == "Experimental" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Start");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("Test");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "ExperimentalStart" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Start");
    }
  else if ( targ == "ExperimentalUpdate" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Update");
    }
  else if ( targ == "ExperimentalConfigure" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Configure");
    }
  else if ( targ == "ExperimentalBuild" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Build");
    }
  else if ( targ == "ExperimentalTest" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Test");
    }
  else if ( targ == "ExperimentalMemCheck"
            || targ == "ExperimentalPurify" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("MemCheck");
    }
  else if ( targ == "ExperimentalCoverage" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Coverage");
    }
  else if ( targ == "ExperimentalSubmit" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Submit");
    }
  else if ( targ == "Continuous" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Start");
    this->SetTest("Update");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("Test");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "ContinuousStart" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Start");
    }
  else if ( targ == "ContinuousUpdate" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Update");
    }
  else if ( targ == "ContinuousConfigure" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Configure");
    }
  else if ( targ == "ContinuousBuild" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Build");
    }
  else if ( targ == "ContinuousTest" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Test");
    }
  else if ( targ == "ContinuousMemCheck"
        || targ == "ContinuousPurify" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("MemCheck");
    }
  else if ( targ == "ContinuousCoverage" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Coverage");
    }
  else if ( targ == "ContinuousSubmit" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Submit");
    }
  else if ( targ == "Nightly" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Start");
    this->SetTest("Update");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("Test");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "NightlyStart" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Start");
    }
  else if ( targ == "NightlyUpdate" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Update");
    }
  else if ( targ == "NightlyConfigure" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Configure");
    }
  else if ( targ == "NightlyBuild" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Build");
    }
  else if ( targ == "NightlyTest" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Test");
    }
  else if ( targ == "NightlyMemCheck"
            || targ == "NightlyPurify" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("MemCheck");
    }
  else if ( targ == "NightlyCoverage" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Coverage");
    }
  else if ( targ == "NightlySubmit" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Submit");
    }
  else if ( targ == "MemoryCheck" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Start");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("MemCheck");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "NightlyMemoryCheck" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Start");
    this->SetTest("Update");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("MemCheck");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else
    {
    return false;
    }
  return true;
}